

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiTests.cpp
# Opt level: O2

void vkt::api::anon_unknown_1::createApiTests(TestCaseGroup *apiTests)

{
  TestContext *testCtx;
  TestNode *pTVar1;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  testCtx = (apiTests->super_TestNode).m_testCtx;
  pTVar1 = &createSmokeTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createFeatureInfoTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createDeviceInitializationTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createObjectManagementTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createBufferTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"buffer_view",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"BufferView tests",&local_52);
  pTVar1 = &createTestGroup(testCtx,&local_30,&local_50,createBufferViewTests)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  pTVar1 = &createCommandBuffersTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createCopiesAndBlittingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createImageClearingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createFillAndUpdateBufferTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createDescriptorPoolTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createNullHandleTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createGranularityQueryTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createMemoryCommitmentTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  return;
}

Assistant:

void createApiTests (tcu::TestCaseGroup* apiTests)
{
	tcu::TestContext&	testCtx		= apiTests->getTestContext();

	apiTests->addChild(createSmokeTests					(testCtx));
	apiTests->addChild(api::createFeatureInfoTests		(testCtx));
	apiTests->addChild(createDeviceInitializationTests	(testCtx));
	apiTests->addChild(createObjectManagementTests		(testCtx));
	apiTests->addChild(createBufferTests				(testCtx));
	apiTests->addChild(createTestGroup					(testCtx, "buffer_view", "BufferView tests", createBufferViewTests));
	apiTests->addChild(createCommandBuffersTests		(testCtx));
	apiTests->addChild(createCopiesAndBlittingTests		(testCtx));
	apiTests->addChild(createImageClearingTests			(testCtx));
	apiTests->addChild(createFillAndUpdateBufferTests	(testCtx));
	apiTests->addChild(createDescriptorPoolTests		(testCtx));
	apiTests->addChild(createNullHandleTests			(testCtx));
	apiTests->addChild(createGranularityQueryTests		(testCtx));
	apiTests->addChild(createMemoryCommitmentTests		(testCtx));
}